

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonschema_draft201909_tests.cpp
# Opt level: O0

void anon_unknown.dwarf_25d1775::jsonschema_tests(string *fpath,evaluation_options *options)

{
  StringRef capturedExpression;
  byte bVar1;
  bool bVar2;
  type_conflict9 tVar3;
  _Ios_Openmode _Var4;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *instance;
  ostream *poVar5;
  iterator this;
  string *in_RDI;
  array_range_type aVar6;
  const_array_range_type cVar7;
  AssertionHandler catchAssertionHandler_1;
  exception *e;
  AssertionHandler catchAssertionHandler;
  anon_class_40_5_b5f75a1a reporter;
  size_t errors;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *test_case;
  iterator __end3;
  iterator __begin3;
  const_array_range_type *__range3;
  int count_test;
  json_schema<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_> compiled;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *test_group;
  iterator __end1;
  iterator __begin1;
  array_range_type *__range1;
  int count;
  json tests;
  fstream is;
  undefined4 in_stack_fffffffffffff898;
  Flags in_stack_fffffffffffff89c;
  evaluation_options *in_stack_fffffffffffff8a0;
  StringRef *in_stack_fffffffffffff8a8;
  AssertionHandler *in_stack_fffffffffffff8b0;
  evaluation_options *in_stack_fffffffffffff8b8;
  evaluation_options *in_stack_fffffffffffff8c0;
  ExprLhs<bool> *in_stack_fffffffffffff8c8;
  AssertionHandler *in_stack_fffffffffffff8d0;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffff8d8;
  string_view_type *in_stack_fffffffffffff8e0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffff8e8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffff8f0;
  anon_class_40_5_b5f75a1a *reporter_00;
  undefined5 in_stack_fffffffffffffa08;
  undefined2 in_stack_fffffffffffffa0e;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffa10;
  evaluation_options *in_stack_fffffffffffffa18;
  _func_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_uri_ptr
  *in_stack_fffffffffffffa20;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffa28;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> local_570 [3];
  undefined1 local_539;
  SourceLineInfo local_528;
  StringRef local_518;
  long *local_4b0;
  string_view_type *local_4a8;
  string *local_4a0;
  int *local_498;
  int *local_490;
  long local_488;
  string_view_type *local_480;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_478;
  __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_470 [3];
  const_array_range_type local_458;
  range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  *local_448;
  int local_43c [21];
  anon_class_40_5_b5f75a1a local_3e8;
  reference local_3c0;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_3b8;
  __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
  local_3b0;
  iterator local_3a8;
  iterator in_stack_fffffffffffffc60;
  basic_istream<char,_std::char_traits<char>_> *in_stack_fffffffffffffc68;
  range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
  *this_00;
  int local_38c;
  undefined1 local_388 [344];
  undefined4 local_230;
  long local_220 [67];
  string *local_8;
  
  local_8 = in_RDI;
  _Var4 = std::operator|(_S_in,_S_out);
  std::fstream::fstream(local_220,in_RDI,_Var4);
  bVar1 = std::ios::operator!((ios *)((long)local_220 + *(long *)(local_220[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    memset(local_388,0,0x148);
    jsoncons::basic_json_options<char>::basic_json_options
              ((basic_json_options<char> *)in_stack_fffffffffffff8b0);
    jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::parse
              (in_stack_fffffffffffffc68,
               (basic_json_decode_options<char> *)in_stack_fffffffffffffc60._M_current);
    jsoncons::basic_json_options<char>::~basic_json_options
              ((basic_json_options<char> *)in_stack_fffffffffffff8a0);
    local_38c = 0;
    aVar6 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                      (in_stack_fffffffffffff8f0);
    this = aVar6.last_._M_current;
    local_3a8 = aVar6.first_._M_current;
    this_00 = (range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
               *)&local_3a8;
    local_3b0._M_current =
         (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
         jsoncons::
         range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
         ::begin(this_00);
    local_3b8 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                jsoncons::
                range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                ::end(this_00);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffff8a0,
                         (__normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                          *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      if (!bVar2) break;
      local_3c0 = __gnu_cxx::
                  __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_3b0);
      local_38c = local_38c + 1;
      reporter_00 = &local_3e8;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b0,
                 (char *)in_stack_fffffffffffff8a8);
      instance = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                           (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
      jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8a0,
                 (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      jsoncons::jsonschema::evaluation_options::evaluation_options
                (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
      jsoncons::jsonschema::
      make_json_schema<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>(jsoncons::uri_const&)>
                (in_stack_fffffffffffffa28,in_stack_fffffffffffffa20,in_stack_fffffffffffffa18);
      jsoncons::jsonschema::evaluation_options::~evaluation_options(in_stack_fffffffffffff8a0);
      jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x8fdcd6);
      local_43c[0] = 0;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b0,
                 (char *)in_stack_fffffffffffff8a8);
      jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8d8,(string_view_type *)in_stack_fffffffffffff8d0);
      cVar7 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
              array_range(in_stack_fffffffffffff8f0);
      local_448 = &local_458;
      local_458 = cVar7;
      local_470[0]._M_current =
           (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
           jsoncons::
           range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
           ::begin(local_448);
      local_478 = (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                  jsoncons::
                  range<__gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>
                  ::end(local_448);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff8a0,
                           (__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                            *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        if (!bVar2) break;
        local_4a8 = (string_view_type *)
                    __gnu_cxx::
                    __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
                    ::operator*(local_470);
        local_43c[0] = local_43c[0] + 1;
        local_488 = 0;
        local_4b0 = &local_488;
        local_4a0 = local_8;
        local_498 = &local_38c;
        local_490 = local_43c;
        local_480 = local_4a8;
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b0,
                   (char *)in_stack_fffffffffffff8a8);
        jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::at
                  (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
        jsoncons::jsonschema::
        json_schema<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>::
        validate<(anonymous_namespace)::jsonschema_tests(std::__cxx11::string_const&,jsoncons::jsonschema::evaluation_options)::__0>
                  ((json_schema<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)this._M_current,instance,reporter_00);
        if (local_488 == 0) {
          local_518 = operator____catch_sr
                                ((char *)in_stack_fffffffffffff8a0,
                                 CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          Catch::SourceLineInfo::SourceLineInfo
                    (&local_528,
                     "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/jsonschema/src/jsonschema_draft202012_tests.cpp"
                     ,0x53);
          Catch::StringRef::StringRef
                    ((StringRef *)in_stack_fffffffffffff8b0,(char *)in_stack_fffffffffffff8a8);
          capturedExpression.m_size = (size_type)in_stack_fffffffffffff8c0;
          capturedExpression.m_start = (char *)in_stack_fffffffffffff8b8;
          Catch::AssertionHandler::AssertionHandler
                    (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,
                     (SourceLineInfo *)in_stack_fffffffffffff8a0,capturedExpression,
                     in_stack_fffffffffffff89c);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b0,
                     (char *)in_stack_fffffffffffff8a8);
          jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8d8,(string_view_type *)in_stack_fffffffffffff8d0);
          jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as<bool>
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8a0);
          local_539 = Catch::Decomposer::operator<=
                                ((Decomposer *)
                                 CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),false
                                );
          Catch::AssertionHandler::handleExpr<bool>
                    (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
          Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff8a0);
          Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)in_stack_fffffffffffff8a0);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b0,
                     (char *)in_stack_fffffffffffff8a8);
          jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8d8,(string_view_type *)in_stack_fffffffffffff8d0);
          tVar3 = jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                  as<bool>((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                           in_stack_fffffffffffff8a0);
          if (((tVar3 ^ 0xffU) & 1) != 0) {
            poVar5 = std::operator<<((ostream *)&std::cout,"  File: ");
            poVar5 = std::operator<<(poVar5,local_8);
            std::operator<<(poVar5,"\n");
            poVar5 = std::operator<<((ostream *)&std::cout,"  Test case ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_38c);
            poVar5 = std::operator<<(poVar5,".");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_43c[0]);
            std::operator<<(poVar5,": ");
            in_stack_fffffffffffff8e8 = local_570;
            in_stack_fffffffffffff8e0 = local_480;
            std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                      ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff8b0
                       ,(char *)in_stack_fffffffffffff8a8);
            in_stack_fffffffffffff8f0 =
                 jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
                 operator[]((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            in_stack_fffffffffffff8d8,(string_view_type *)in_stack_fffffffffffff8d0)
            ;
            in_stack_fffffffffffff8d8 =
                 jsoncons::operator<<
                           (in_stack_fffffffffffffa10,
                            (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            CONCAT26(in_stack_fffffffffffffa0e,
                                     CONCAT15(bVar1,in_stack_fffffffffffffa08)));
            std::operator<<(in_stack_fffffffffffff8d8,"\n");
          }
        }
        __gnu_cxx::
        __normal_iterator<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
        ::operator++(local_470);
      }
      jsoncons::jsonschema::
      json_schema<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>::
      ~json_schema((json_schema<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                    *)0x8fe31a);
      __gnu_cxx::
      __normal_iterator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>
      ::operator++(&local_3b0);
    }
    jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)0x8fe5a8);
    local_230 = 0;
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cout,"Cannot open file: ");
    poVar5 = std::operator<<(poVar5,local_8);
    std::operator<<(poVar5,"\n");
    local_230 = 1;
  }
  std::fstream::~fstream(local_220);
  return;
}

Assistant:

void jsonschema_tests(const std::string& fpath,
        jsonschema::evaluation_options options = jsonschema::evaluation_options{}.default_version(jsonschema::schema_version::draft201909()))
    {
        std::fstream is(fpath);
        if (!is)
        {
            std::cout << "Cannot open file: " << fpath << "\n";
            return;
        }

        json tests = json::parse(is); 
        //std::cout << pretty_print(tests) << "\n";

        int count = 0;
        for (const auto& test_group : tests.array_range()) 
        {
            ++count;
            try
            {
                jsonschema::json_schema<json> compiled = jsonschema::make_json_schema(test_group.at("schema"), resolver, 
                    options);

                int count_test = 0;
                for (const auto& test_case : test_group["tests"].array_range()) 
                {
                    //std::cout << "  Test case " << count << "." << count_test << ": " << test_case["description"] << "\n";
                    ++count_test;
                    std::size_t errors = 0;
                    auto reporter = [&](const jsonschema::validation_message& msg) -> jsonschema::walk_result
                    {
                        ++errors;
                        CHECK_FALSE(test_case["valid"].as<bool>());
                        if (test_case["valid"].as<bool>())
                        {
                            std::cout << "  File: " << fpath << "\n";
                            std::cout << "  Test case " << count << "." << count_test << ": " << test_case["description"] << "\n";
                            std::cout << "  Failed: " << msg.instance_location().string() << ": " << msg.message() << "\n";
                            for (const auto& err : msg.details())
                            {
                                std::cout << "  Nested error: " << err.instance_location().string() << ": " << err.message() << "\n";
                            }
                        }
                        return jsonschema::walk_result::advance;
                    };
                    compiled.validate(test_case.at("data"), reporter);
                    if (errors == 0)
                    {
                        CHECK(test_case["valid"].as<bool>());
                        if (!test_case["valid"].as<bool>())
                        {
                            std::cout << "  File: " << fpath << "\n";
                            std::cout << "  Test case " << count << "." << count_test << ": " << test_case["description"] << "\n";
                        }
                    }
                }
            }
            catch (const std::exception& e)
            {
                std::cout << "  File: " << fpath << " " << count << "\n";
                std::cout << e.what() << "\n\n";
                CHECK(false);
            }
        }
    }